

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcrcell.c
# Opt level: O0

LispPTR gcreccell(LispPTR cell)

{
  DLword *pDVar1;
  DLword *pDVar2;
  ushort uVar3;
  uint codebase;
  LispPTR LVar4;
  LispPTR *pLVar5;
  long lVar6;
  long lVar7;
  uint local_17cc;
  short asStack_17c8 [2];
  uint do_count;
  short to_do_offset [1000];
  LispPTR to_do [1000];
  LispPTR *field;
  uint local_40;
  int code;
  int index;
  LispPTR carfield;
  LispPTR ptrfield;
  LispPTR val;
  LispPTR tmpcell;
  LispPTR donext;
  LispPTR tmpptr;
  DLword typ;
  dtd *typdtd;
  ConsCell *ptr;
  LispPTR cell_local;
  
  local_17cc = 0;
  carfield = 0;
  local_40 = 0xffffffff;
  val = 0;
  tmpcell = cell;
  do {
    typdtd = (dtd *)NativeAligned4FromLAddr(tmpcell & 0xfffffffe);
    codebase = tmpcell & 0xfffffffe;
    if ((tmpcell & 0xfff0000) == 0x60000) {
      error("freeing an old atom??");
    }
    uVar3 = *(ushort *)((ulong)(MDStypetbl + (tmpcell >> 9)) ^ 2) & 0x7ff;
    switch(uVar3) {
    case 0:
      if ((local_40 != 0xffffffff) || (LVar4 = reclaimarrayblock(codebase), LVar4 == 0)) break;
      goto LAB_0013c9bf;
    default:
      break;
    case 5:
      field._4_4_ = *(uint *)typdtd >> 0x1c;
      tmpcell = codebase;
      if (field._4_4_ == 0) {
        tmpcell = *(uint *)typdtd & 0xfffffff;
        freelistcell(codebase);
        typdtd = (dtd *)NativeAligned4FromLAddr(tmpcell);
        field._4_4_ = *(uint *)typdtd >> 0x1c;
      }
      pDVar1 = MDStypetbl;
      if (local_40 == 0xffffffff) {
        LVar4 = car(tmpcell);
        if (((*(ushort *)((ulong)(pDVar1 + (LVar4 >> 9)) ^ 2) & 0x8000) == 0) &&
           (*GcDisabled_word != 0x4c)) {
          LVar4 = car(tmpcell);
          carfield = rec_htfind(LVar4,1);
        }
        else {
          carfield = 0;
        }
        if (carfield == 0) goto LAB_0013c5f3;
        *(uint *)typdtd = *(uint *)typdtd & 0xf0000000 | val & 0xfffffff;
        *(uint *)typdtd = *(uint *)typdtd & 0xfffffff | field._4_4_ << 0x1c;
        val = tmpcell;
      }
      else {
        local_40 = 0xffffffff;
LAB_0013c5f3:
        pDVar1 = MDStypetbl;
        LVar4 = cdr(tmpcell);
        if (((*(ushort *)((ulong)(pDVar1 + (LVar4 >> 9)) ^ 2) & 0x8000) == 0) &&
           (*GcDisabled_word != 0x4c)) {
          LVar4 = cdr(tmpcell);
          carfield = rec_htfind(LVar4,1);
        }
        else {
          carfield = 0;
        }
        if (field._4_4_ < 8) {
          freelistcell(tmpcell + field._4_4_ * 2);
        }
        freelistcell(tmpcell);
      }
      goto LAB_0013c961;
    case 8:
      if (local_40 == 0xffffffff) {
        LVar4 = reclaimstackp(codebase);
joined_r0x0013c6ee:
        if (LVar4 != 0) goto LAB_0013c9bf;
      }
      break;
    case 10:
      if (local_40 == 0xffffffff) {
        LVar4 = releasingvmempage(codebase);
        goto joined_r0x0013c6ee;
      }
      break;
    case 0x40:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
      if (local_40 == 0xffffffff) {
        LVar4 = reclaimcodeblock(codebase);
        goto joined_r0x0013c6ee;
      }
    }
    pDVar1 = DTDspace;
    lVar6 = (long)(int)((uint)uVar3 << 4);
    lVar7 = (long)(int)((uint)uVar3 << 1);
    index = *(int *)(DTDspace + lVar6 + lVar7 + 10);
    if (local_40 != 0xffffffff) {
      index = cdr(index);
      while (LVar4 = car(index), (LVar4 & 0xffff) != local_40 << 1) {
        index = cdr(index);
      }
      local_40 = 0xffffffff;
    }
    do {
      if (index == 0) goto LAB_0013c938;
      LVar4 = car(index);
      index = cdr(index);
      pDVar2 = MDStypetbl;
      pLVar5 = NativeAligned4FromLAddr(codebase + (LVar4 & 0xffff));
      if (((*(ushort *)((ulong)(pDVar2 + ((*pLVar5 & 0xfffffff) >> 9)) ^ 2) & 0x8000) == 0) &&
         (*GcDisabled_word != 0x4c)) {
        pLVar5 = NativeAligned4FromLAddr(codebase + (LVar4 & 0xffff));
        carfield = rec_htfind(*pLVar5 & 0xfffffff,1);
      }
      else {
        carfield = 0;
      }
    } while (carfield == 0);
    if (index == 0) {
LAB_0013c938:
      pLVar5 = NativeAligned4FromLAddr(codebase);
      *pLVar5 = *(LispPTR *)(pDVar1 + lVar6 + lVar7 + 4);
      *(LispPTR *)(pDVar1 + lVar6 + lVar7 + 4) = tmpcell & 0xffffffe;
    }
    else {
      LVar4 = car(index);
      if ((LVar4 & 0xffff) >> 1 < 0xf) {
        pLVar5 = NativeAligned4FromLAddr(codebase);
        *pLVar5 = *pLVar5 & 0xf0000000 | val & 0xfffffff;
        LVar4 = car(index);
        *pLVar5 = *pLVar5 & 0xfffffff | ((LVar4 & 0xffff) >> 1) << 0x1c;
        val = codebase;
      }
      else if (local_17cc < 1000) {
        if ((tmpcell & 0xf0000000) != 0) {
          error("illegal ptr in addtodo");
        }
        to_do[(ulong)local_17cc - 2] = codebase;
        LVar4 = car(index);
        asStack_17c8[local_17cc] = (short)((LVar4 & 0xffff) >> 1);
        todo_uses = todo_uses + 1;
        local_17cc = local_17cc + 1;
      }
      else {
        todo_misses = todo_misses + 1;
      }
    }
LAB_0013c961:
    if (carfield == 0) {
LAB_0013c9bf:
      if (val == 0) {
        if (local_17cc == 0) {
          return 0;
        }
        local_17cc = local_17cc - 1;
        tmpcell = to_do[(ulong)local_17cc - 2];
        local_40 = (uint)asStack_17c8[local_17cc];
        todo_reads = todo_reads + 1;
      }
      else {
        tmpcell = val;
        pLVar5 = NativeAligned4FromLAddr(val);
        val = *pLVar5 & 0xfffffff;
        local_40 = *pLVar5 >> 0x1c;
      }
    }
    else {
      tmpcell = carfield;
      if (((*(ushort *)((ulong)(MDStypetbl + (carfield >> 9)) ^ 2) & 0x8000) == 0) &&
         (*GcDisabled_word != 0x4c)) {
        rec_htfind(carfield,0);
      }
      carfield = 0;
    }
  } while( true );
}

Assistant:

LispPTR gcreccell(LispPTR cell) {
  ConsCell *ptr;
  struct dtd *typdtd;
  DLword typ;
  LispPTR tmpptr, donext, tmpcell, val;
  LispPTR ptrfield, carfield;
  int index, code;
  LispPTR *field;

#ifdef NEWCDRCODING
  LispPTR to_do[TODO_LIMIT];      /* table of pointers to follow, since Cdr coding lost */
  short to_do_offset[TODO_LIMIT]; /* offset in datatype */
  unsigned do_count = 0;          /* counter of entries in to_do table */
#endif                            /* NEWCDRCODING */

  val = NIL;
  tmpptr = cell;
  index = -1;
  donext = NIL;
lp:
  ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr & -2);
/* # ifdef CHECK
  if (refcnt(tmpptr) != 1) error("reclaiming cell w/refcnt not 1");
 # endif
*/
#ifdef DEBUG
  if (tmpptr & 1) error("Reclaiming cell pointer with low bit 1.");
#else
  tmpptr &= -2; /* turn off low bit of pointer, so we never reclaim odd'ns */
#endif

  if ((tmpptr & 0x0FFF0000) == 0x60000) error("freeing an old atom??");

  typ = GetTypeNumber(tmpptr);
#ifdef DEBUG
  if (typ == 6) printf("Reclaiming array ptr 0x%x.\n", tmpptr);
#endif
  switch (typ) {
    case TYPE_LISTP: {
      if ((code = ptr->cdr_code) == CDR_INDIRECT) /* indirect */
      {
        tmpcell = ptr->car_field; /* Monitor */
        freelistcell(tmpptr);
        ptr = (ConsCell *)NativeAligned4FromLAddr(tmpcell);
        tmpptr = tmpcell;
        code = ptr->cdr_code;
      }
      if (index != -1) /* car part */
        index = -1;
      else {
        REC_GCLOOKUPV(car(tmpptr), DELREF, val);
        if (val != NIL) {
          ptr->car_field = donext;
          ptr->cdr_code = code;
          donext = tmpptr;
          goto doval;
        }
      }
      REC_GCLOOKUPV(cdr(tmpptr), DELREF, val);
      if (code <= CDR_MAXINDIRECT) {
#ifdef NEWCDRCODING
        tmpcell = tmpptr + ((code - CDR_INDIRECT) << 1);
#else
        tmpcell = POINTER_PAGEBASE(tmpptr) + ((code - CDR_INDIRECT) << 1);
#endif /* NEWCDRCODING */
        freelistcell(tmpcell);
      }
      freelistcell(tmpptr);
      goto doval;
    }
    case TYPE_ARRAYBLOCK:
      if ((index == -1) && reclaimarrayblock(tmpptr))
        goto trynext;
      else
        break;
    case TYPE_STACKP:
      if ((index == -1) && reclaimstackp(tmpptr)) goto trynext;
      break;
    case TYPE_VMEMPAGEP:
      if ((index == -1) && releasingvmempage(tmpptr)) {
        goto trynext;
      } else
        break;
    case TYPE_CODEHUNK1:
    case TYPE_CODEHUNK2:
    case TYPE_CODEHUNK3:
    case TYPE_CODEHUNK4:
    case TYPE_CODEHUNK5:
    case TYPE_CODEHUNK6:
    case TYPE_CODEHUNK7:
    case TYPE_CODEHUNK8:
    case TYPE_CODEHUNK9:
    case TYPE_CODEHUNK10:
      if ((index == -1) && reclaimcodeblock(tmpptr))
        goto trynext;
      else
        break;
    default:;
  }
normal:
  typdtd = (struct dtd *)GetDTD(typ);
  ptrfield = typdtd->dtd_ptrs;
  if (index != -1) {
    index = (index << 1);
    ptrfield = cdr(ptrfield);
    while ((car(ptrfield) & 0x0ffff) != index) ptrfield = cdr(ptrfield);
    index = -1;
  }
  while (ptrfield != NIL) {
    carfield = car(ptrfield);
    ptrfield = cdr(ptrfield);
    carfield &= 0x0ffff;
    REC_GCLOOKUPV((POINTERMASK & *(LispPTR *)NativeAligned4FromLAddr(tmpptr + carfield)), DELREF, val);
#ifndef NEWCDRCODING
    if (val != NIL) {
      if (ptrfield != NIL) {
        ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr);
        ptr->car_field = donext;
        ptr->cdr_code = ((car(ptrfield) & 0x0ffff) >> 1);
        donext = tmpptr;
        goto doval;
      } else
        goto addtofreelist;
    }
#else
    if (val != NIL) {
      if (ptrfield != NIL) {
        if ((carfield = car(ptrfield) & 0x0ffff) >> 1 < 15) {
          ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr);
          ptr->car_field = donext;
          ptr->cdr_code = ((car(ptrfield) & 0x0ffff) >> 1);
          donext = tmpptr;
          goto doval;
        } else {
          ADD_TO_DO(tmpptr, (car(ptrfield) & 0xffff) >> 1);
          goto doval;
        }
      } else
        goto addtofreelist;
    }
#endif /* NEWCDRCODING */
  }
addtofreelist:
  field = (LispPTR *)NativeAligned4FromLAddr(tmpptr);
  *field = typdtd->dtd_free;
  typdtd->dtd_free = tmpptr & POINTERMASK;
#ifdef DTDDEBUG
  check_dtd_chain(GetTypeNumber(tmpptr & POINTERMASK));
#endif

/******************************/
/*								*/
/*  Freeing one cell made another cell's refcnt = 0. */
/*  ADDREF the second cell (to remove it from the GC table) */
/*  and reclaim it.				*/
/************************************************************/
doval:
  if (val != NIL) {
    tmpptr = val;
    REC_GCLOOKUP(tmpptr, ADDREF);
    /*	GCLOOKUP(0x8000, ADDREF,tmpptr); */
    val = NIL;
    goto lp;
  }

/***************************************************************/
/*									*/
/*  Finished freeing the main cell, but we may have saved other */
/*  cells whose refcnt's went to 0 along the way.  This is      */
/*  where we work down the list of saved items to free.         */
/*									*/
/****************************************************************/
trynext:
  if (donext != NIL) {
    tmpptr = donext;
    ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr);
    donext = (LispPTR)ptr->car_field;
    index = ptr->cdr_code;
    goto lp;
  }
#ifdef NEWCDRCODING
  if (do_count) /* If there are other cells to collect */
  {
    do_count--;
    tmpptr = to_do[do_count];
    index = to_do_offset[do_count];
    todo_reads++;
    /*REC_GCLOOKUP(tmpptr, ADDREF); */
    goto lp;
  }
#endif /*NEWCDRCODING */
  return (NIL);
}